

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O0

void __thiscall
icu_63::PluralFormat::PluralFormat
          (PluralFormat *this,Locale *loc,UnicodeString *pat,UErrorCode *status)

{
  UErrorCode *status_local;
  UnicodeString *pat_local;
  Locale *loc_local;
  PluralFormat *this_local;
  
  Format::Format(&this->super_Format);
  (this->super_Format).super_UObject._vptr_UObject = (_func_int **)&PTR__PluralFormat_004f4430;
  Locale::Locale(&this->locale,loc);
  MessagePattern::MessagePattern(&this->msgPattern,status);
  this->numberFormat = (NumberFormat *)0x0;
  this->offset = 0.0;
  PluralSelectorAdapter::PluralSelectorAdapter(&this->pluralRulesWrapper);
  init(this,(EVP_PKEY_CTX *)0x0);
  applyPattern(this,pat,status);
  return;
}

Assistant:

PluralFormat::PluralFormat(const Locale& loc,
                           const UnicodeString& pat,
                           UErrorCode& status)
        : locale(loc),
          msgPattern(status),
          numberFormat(NULL),
          offset(0) {
    init(NULL, UPLURAL_TYPE_CARDINAL, status);
    applyPattern(pat, status);
}